

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Term_text_x11(wchar_t x,wchar_t y,wchar_t n,wchar_t a,wchar_t *s)

{
  wchar_t *s_local;
  wchar_t a_local;
  wchar_t n_local;
  wchar_t y_local;
  wchar_t x_local;
  
  Infoclr = clr[(a / 0x100) * 0x20 + a % 0x20];
  Infofnt_text_std(x,y,s,n);
  return 0;
}

Assistant:

static errr Term_text_x11(int x, int y, int n, int a, const wchar_t *s)
{
	/* Draw the text */
	Infoclr_set(clr[(a / MULT_BG) * MAX_COLORS + (a % MAX_COLORS)]);

	/* Draw the text */
	Infofnt_text_std(x, y, s, n);

	/* Success */
	return (0);
}